

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O1

int ddGroupSifting(DdManager *table,int lower,int upper,DD_CHKFP checkFunction,int lazyFlag)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  DdSubtable *pDVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  void *__base;
  int *piVar8;
  void *__ptr;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  code *checkFunction_00;
  uint uVar15;
  long lVar16;
  int iVar17;
  
  iVar6 = table->size;
  lVar13 = (long)iVar6;
  entry = (int *)0x0;
  __size = lVar13 * 4;
  __base = malloc(__size);
  if (((__base == (void *)0x0) ||
      (piVar8 = (int *)malloc(__size), entry = piVar8, piVar8 == (int *)0x0)) ||
     (__ptr = malloc(__size), __ptr == (void *)0x0)) {
    table->errorCode = CUDD_MEMORY_OUT;
    __ptr = (void *)0x0;
LAB_00923a3d:
    if (entry != (int *)0x0) {
      free(entry);
      entry = (int *)0x0;
    }
    if (__base != (void *)0x0) {
      free(__base);
    }
    iVar6 = 0;
    if (__ptr != (void *)0x0) {
      free(__ptr);
      iVar6 = 0;
    }
  }
  else {
    if (iVar6 < 1) {
      iVar17 = 0;
    }
    else {
      pDVar3 = table->subtables;
      piVar4 = table->perm;
      lVar12 = 0;
      iVar17 = 0;
      do {
        *(undefined4 *)((long)__ptr + lVar12 * 4) = 0;
        uVar1 = piVar4[lVar12];
        if (pDVar3[(int)uVar1].next <= uVar1) {
          piVar8[lVar12] = pDVar3[(int)uVar1].keys;
          *(int *)((long)__base + (long)iVar17 * 4) = (int)lVar12;
          iVar17 = iVar17 + 1;
        }
        lVar12 = lVar12 + 1;
      } while (lVar13 != lVar12);
    }
    qsort(__base,(long)iVar17,4,ddUniqueCompareGroup);
    if (0 < iVar6 && lazyFlag != 0) {
      iVar6 = table->size;
      lVar12 = 0;
      do {
        if (lVar12 < iVar6) {
          table->subtables[table->perm[lVar12]].varHandled = 0;
        }
        lVar12 = lVar12 + 1;
      } while (lVar13 != lVar12);
    }
    iVar6 = table->siftMaxVar;
    if (iVar17 < table->siftMaxVar) {
      iVar6 = iVar17;
    }
    if (0 < iVar6) {
      lVar13 = 0;
      do {
        if (table->siftMaxSwap <= ddTotalNumberSwapping) break;
        iVar6 = *(int *)((long)__base + lVar13 * 4);
        lVar12 = (long)iVar6;
        if ((*(int *)((long)__ptr + lVar12 * 4) != 1) &&
           (uVar1 = table->perm[lVar12], (int)uVar1 <= upper && lower <= (int)uVar1)) {
          if (table->subtables[(int)uVar1].bindVar != 1) {
            uVar2 = table->subtables[(int)uVar1].next;
            checkFunction_00 = checkFunction;
            if (uVar1 != uVar2) {
              checkFunction_00 = ddNoCheck;
            }
            iVar7 = ddGroupSiftingAux(table,uVar1,lower,upper,checkFunction_00,lazyFlag);
            if (iVar7 == 0) goto LAB_00923a3d;
            bVar5 = false;
            uVar14 = uVar1;
            if ((lazyFlag == 0) && (table->groupcheck == CUDD_GROUP_CHECK7)) {
              uVar14 = table->perm[lVar12];
              lVar16 = (long)(int)uVar14;
              if (uVar14 == table->subtables[lVar16].next) {
                bVar5 = false;
                if ((uVar14 != upper) &&
                   (bVar5 = false, *(int *)((long)__ptr + (long)table->invperm[lVar16 + 1] * 4) == 0
                   )) {
                  uVar11 = lVar16 + 1;
                  uVar15 = (uint)uVar11;
                  bVar5 = false;
                  if (uVar15 == table->subtables[uVar11].next) {
                    iVar7 = ddSecDiffCheck(table,uVar14,uVar15);
                    bVar5 = false;
                    if (iVar7 != 0) {
                      pDVar3 = table->subtables;
                      do {
                        uVar9 = (uint)uVar11;
                        uVar11 = (ulong)pDVar3[(int)uVar9].next;
                      } while (uVar9 < pDVar3[(int)uVar9].next);
                      pDVar3[lVar16].next = uVar15;
                      pDVar3[(int)uVar9].next = uVar14;
                      bVar5 = true;
                    }
                  }
                }
                if ((uVar14 != lower) &&
                   (*(int *)((long)__ptr + (long)table->invperm[lVar16 + -1] * 4) == 0)) {
                  lVar16 = lVar16 + -1;
                  uVar15 = (uint)lVar16;
                  if ((uVar15 == table->subtables[lVar16].next) &&
                     (iVar7 = ddSecDiffCheck(table,uVar15,uVar14), iVar7 != 0)) {
                    pDVar3 = table->subtables;
                    uVar9 = uVar14;
                    do {
                      uVar10 = uVar9;
                      uVar9 = pDVar3[(int)uVar10].next;
                    } while (uVar10 < pDVar3[(int)uVar10].next);
                    pDVar3[lVar16].next = uVar14;
                    pDVar3[(int)uVar10].next = uVar15;
                    bVar5 = true;
                  }
                }
              }
            }
            if (bVar5) {
              do {
                uVar15 = uVar14;
                uVar14 = table->subtables[(int)uVar15].next;
              } while (uVar15 < uVar14);
              iVar7 = ddGroupSiftingAux(table,uVar15,lower,upper,ddNoCheck,lazyFlag);
              if (iVar7 == 0) goto LAB_00923a3d;
            }
            pDVar3 = table->subtables;
            piVar8 = table->perm;
            uVar14 = piVar8[lVar12];
            if (uVar14 != pDVar3[(int)uVar14].next) {
              piVar4 = table->invperm;
              uVar15 = uVar14;
              do {
                *(undefined4 *)((long)__ptr + (long)piVar4[(int)uVar15] * 4) = 1;
                uVar15 = pDVar3[(int)uVar15].next;
              } while (uVar15 != uVar14);
              if ((lazyFlag == 0) && (uVar1 == uVar2)) {
                do {
                  uVar1 = pDVar3[(int)uVar15].next;
                  pDVar3[(int)uVar15].next = uVar15;
                  uVar15 = uVar1;
                } while (uVar1 != uVar14);
              }
            }
            if (((lazyFlag != 0) && (-1 < iVar6)) && (iVar6 < table->size)) {
              pDVar3[piVar8[lVar12]].varHandled = 1;
            }
          }
        }
        lVar13 = lVar13 + 1;
        iVar6 = table->siftMaxVar;
        if (iVar17 < table->siftMaxVar) {
          iVar6 = iVar17;
        }
      } while (lVar13 < iVar6);
    }
    free(__ptr);
    free(__base);
    iVar6 = 1;
    if (entry != (int *)0x0) {
      free(entry);
      entry = (int *)0x0;
    }
  }
  return iVar6;
}

Assistant:

static int
ddGroupSifting(
  DdManager * table,
  int  lower,
  int  upper,
  DD_CHKFP checkFunction,
  int lazyFlag)
{
    int         *var;
    int         i,j,x,xInit;
    int         nvars;
    int         classes;
    int         result;
    int         *sifted;
    int         merged;
    int         dissolve;
#ifdef DD_STATS
    unsigned    previousSize;
#endif
    int         xindex;

    nvars = table->size;

    /* Order variables to sift. */
    entry = NULL;
    sifted = NULL;
    var = ABC_ALLOC(int,nvars);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddGroupSiftingOutOfMem;
    }
    entry = ABC_ALLOC(int,nvars);
    if (entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddGroupSiftingOutOfMem;
    }
    sifted = ABC_ALLOC(int,nvars);
    if (sifted == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto ddGroupSiftingOutOfMem;
    }

    /* Here we consider only one representative for each group. */
    for (i = 0, classes = 0; i < nvars; i++) {
        sifted[i] = 0;
        x = table->perm[i];
        if ((unsigned) x >= table->subtables[x].next) {
            entry[i] = table->subtables[x].keys;
            var[classes] = i;
            classes++;
        }
    }

    qsort((void *)var,(size_t)classes,sizeof(int),
          (DD_QSFP) ddUniqueCompareGroup);

    if (lazyFlag) {
        for (i = 0; i < nvars; i ++) {
            ddResetVarHandled(table, i);
        }
    }

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar,classes); i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        xindex = var[i];
        if (sifted[xindex] == 1) /* variable already sifted as part of group */
            continue;
        x = table->perm[xindex]; /* find current level of this variable */

        if (x < lower || x > upper || table->subtables[x].bindVar == 1)
            continue;
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
#ifdef DD_DEBUG
        /* x is bottom of group */
        assert((unsigned) x >= table->subtables[x].next);
#endif
        if ((unsigned) x == table->subtables[x].next) {
            dissolve = 1;
            result = ddGroupSiftingAux(table,x,lower,upper,checkFunction,
                                        lazyFlag);
        } else {
            dissolve = 0;
            result = ddGroupSiftingAux(table,x,lower,upper,ddNoCheck,lazyFlag);
        }
        if (!result) goto ddGroupSiftingOutOfMem;

        /* check for aggregation */
        merged = 0;
        if (lazyFlag == 0 && table->groupcheck == CUDD_GROUP_CHECK7) {
            x = table->perm[xindex]; /* find current level */
            if ((unsigned) x == table->subtables[x].next) { /* not part of a group */
                if (x != upper && sifted[table->invperm[x+1]] == 0 &&
                (unsigned) x+1 == table->subtables[x+1].next) {
                    if (ddSecDiffCheck(table,x,x+1)) {
                        merged =1;
                        ddCreateGroup(table,x,x+1);
                    }
                }
                if (x != lower && sifted[table->invperm[x-1]] == 0 &&
                (unsigned) x-1 == table->subtables[x-1].next) {
                    if (ddSecDiffCheck(table,x-1,x)) {
                        merged =1;
                        ddCreateGroup(table,x-1,x);
                    }
                }
            }
        }

        if (merged) { /* a group was created */
            /* move x to bottom of group */
            while ((unsigned) x < table->subtables[x].next)
                x = table->subtables[x].next;
            /* sift */
            result = ddGroupSiftingAux(table,x,lower,upper,ddNoCheck,lazyFlag);
            if (!result) goto ddGroupSiftingOutOfMem;
#ifdef DD_STATS
            if (table->keys < previousSize + table->isolated) {
                (void) fprintf(table->out,"_");
            } else if (table->keys > previousSize + table->isolated) {
                (void) fprintf(table->out,"^");
            } else {
                (void) fprintf(table->out,"*");
            }
            fflush(table->out);
        } else {
            if (table->keys < previousSize + table->isolated) {
                (void) fprintf(table->out,"-");
            } else if (table->keys > previousSize + table->isolated) {
                (void) fprintf(table->out,"+");
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }

        /* Mark variables in the group just sifted. */
        x = table->perm[xindex];
        if ((unsigned) x != table->subtables[x].next) {
            xInit = x;
            do {
                j = table->invperm[x];
                sifted[j] = 1;
                x = table->subtables[x].next;
            } while (x != xInit);

            /* Dissolve the group if it was created. */
            if (lazyFlag == 0 && dissolve) {
                do {
                    j = table->subtables[x].next;
                    table->subtables[x].next = x;
                    x = j;
                } while (x != xInit);
            }
        }

#ifdef DD_DEBUG
        if (pr > 0) (void) fprintf(table->out,"ddGroupSifting:");
#endif

      if (lazyFlag) ddSetVarHandled(table, xindex);
    } /* for */

    ABC_FREE(sifted);
    ABC_FREE(var);
    ABC_FREE(entry);

    return(1);

ddGroupSiftingOutOfMem:
    if (entry != NULL)  ABC_FREE(entry);
    if (var != NULL)    ABC_FREE(var);
    if (sifted != NULL) ABC_FREE(sifted);

    return(0);

}